

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_item_weapon_shotgun::update_write
          (cse_alife_item_weapon_shotgun *this,xr_packet *packet)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  cse_alife_item_weapon::update_write((cse_alife_item_weapon *)this,packet);
  (*packet->_vptr_xr_packet[10])
            (packet,(ulong)(byte)(this->super_cse_alife_item_weapon_magazined).
                                 super_cse_alife_item_weapon.field_0x217);
  (*packet->_vptr_xr_packet[0x15])
            (packet,(long)(this->m_ammo_ids).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(this->m_ammo_ids).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_30,&this->m_ammo_ids);
  (*packet->_vptr_xr_packet[1])(packet,&local_30);
  if (local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cse_alife_item_weapon_shotgun::update_write(xr_packet& packet)
{
	cse_alife_item_weapon_magazined::update_write(packet);
	packet.w_size_u8(m_ammo_ids.size());
	packet.w_seq(m_ammo_ids);
}